

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int write_dot_dot_entry(archive_write *a,mtree_entry_conflict *n)

{
  long lVar1;
  int iVar2;
  size_t in_RSI;
  void *in_RDI;
  int pd;
  mtree_writer *unaff_retaddr;
  int i;
  int ret;
  mtree_writer *mtree;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)((long)in_RDI + 0xd0);
  if (*(long *)(in_RSI + 0x38) != 0) {
    if (*(int *)(lVar1 + 0xf8) != 0) {
      in_stack_ffffffffffffffdc = *(int *)(lVar1 + 0xdc) << 2;
      for (in_stack_ffffffffffffffe0 = 0; in_stack_ffffffffffffffe0 < in_stack_ffffffffffffffdc;
          in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1) {
        archive_strappend_char
                  ((archive_string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (char)((uint)in_stack_ffffffffffffffdc >> 0x18));
      }
    }
    archive_string_sprintf
              ((archive_string *)(lVar1 + 0x58),"# %s/%s\n",*(undefined8 *)(in_RSI + 0x38),
               *(undefined8 *)(in_RSI + 0x50));
  }
  if (*(int *)(lVar1 + 0xf8) == 0) {
    archive_strncat((archive_string *)unaff_retaddr,in_RDI,in_RSI);
  }
  else {
    *(undefined8 *)(lVar1 + 0x48) = 0;
    archive_strncat((archive_string *)unaff_retaddr,in_RDI,in_RSI);
    mtree_indent(unaff_retaddr);
  }
  if (*(ulong *)(lVar1 + 0x60) < 0x8001) {
    iVar2 = 0;
  }
  else {
    iVar2 = __archive_write_output
                      ((archive_write *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       0x18f930);
    *(undefined8 *)(lVar1 + 0x60) = 0;
  }
  return iVar2;
}

Assistant:

static int
write_dot_dot_entry(struct archive_write *a, struct mtree_entry *n)
{
	struct mtree_writer *mtree = a->format_data;
	int ret;

	if (n->parentdir.s) {
		if (mtree->indent) {
			int i, pd = mtree->depth * 4;
			for (i = 0; i < pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
		}
		archive_string_sprintf(&mtree->buf, "# %s/%s\n",
			n->parentdir.s, n->basename.s);
	}

	if (mtree->indent) {
		archive_string_empty(&mtree->ebuf);
		archive_strncat(&mtree->ebuf, "..\n\n", (mtree->dironly)?3:4);
		mtree_indent(mtree);
	} else
		archive_strncat(&mtree->buf, "..\n\n", (mtree->dironly)?3:4);

	if (mtree->buf.length > 32768) {
		ret = __archive_write_output(
			a, mtree->buf.s, mtree->buf.length);
		archive_string_empty(&mtree->buf);
	} else
		ret = ARCHIVE_OK;
	return (ret);
}